

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferDepth::iterate(GeometryShaderLayeredFramebufferDepth *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TestError *this_00;
  uchar *puVar7;
  pointer_____offset_0x10___ *ppuVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  char *gs_code;
  char *fs_code;
  undefined1 local_1f8 [120];
  ios_base local_180 [264];
  uchar buffer [64];
  long lVar6;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1.0);\n}\n"
  ;
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                          in;\nlayout(triangle_strip, max_vertices=64) out;\n\nvoid main()\n{\n    for (int n = 0; n < 4; ++n)\n    {\n        float depth = -1.0 + float(n) * 0.5;\n\n        gl_Layer    = n;\n        gl_Position = vec4(1, 1, depth, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(1, -1, depth, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, 1, depth, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, -1, depth, 1);\n        EmitVertex();\n\n        EndPrimitive();\n    }\n}\n"
  ;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0x3c8);
    ppuVar8 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (**(code **)(lVar6 + 0x6f8))(1);
    (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_b_id);
    (**(code **)(lVar6 + 0xb8))(0x8c1a,this->m_to_a_id);
    (**(code **)(lVar6 + 0x1398))(0x8c1a,1,0x8058,4,4,4);
    (**(code **)(lVar6 + 0xb8))(0x8c1a,this->m_to_b_id);
    (**(code **)(lVar6 + 0x1398))(0x8c1a,1,0x8cac,4,4,4);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Could not initialize texture objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x3d5);
    (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_id);
    (**(code **)(lVar6 + 0x6d0))(1,&this->m_read_fbo_id);
    (**(code **)(lVar6 + 0x78))(0x8ca9,this->m_fbo_id);
    (**(code **)(lVar6 + 0x690))(0x8ca9,0x8ce0,this->m_to_a_id,0);
    (**(code **)(lVar6 + 0x690))(0x8ca9,0x8d00,this->m_to_b_id,0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Could not initialize framebuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x3e0);
    iVar3 = (**(code **)(lVar6 + 0x170))(0x8ca9);
    if (iVar3 == 0x8cd5) {
      GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar5;
      GVar5 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
      ;
      this->m_gs_id = GVar5;
      GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar5;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not initialize shader objects",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x3f0);
      GVar5 = (**(code **)(lVar6 + 0x3c8))();
      this->m_po_id = GVar5;
      bVar2 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,GVar5,this->m_fs_id,1,&fs_code,this->m_gs_id,1,
                         &gs_code,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code,(bool *)0x0);
      if (bVar2) {
        (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
        (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Could not bind vertex array object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x3ff);
        (**(code **)(lVar6 + 0x1c0))(0,0,0,0);
        (**(code **)(lVar6 + 0x1d0))(0x3f000000);
        (**(code **)(lVar6 + 0x188))(0x4100);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Depth buffer clear operation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x406);
        (**(code **)(lVar6 + 0x1680))(this->m_po_id);
        uVar11 = 0;
        (**(code **)(lVar6 + 0x1a00))(0,0,4,4);
        (**(code **)(lVar6 + 0x5e0))(0xb71);
        (**(code **)(lVar6 + 0x538))(0,0,1);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Rendering failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x40f);
        (**(code **)(lVar6 + 0x78))(0x8ca8,this->m_read_fbo_id);
        do {
          (**(code **)(lVar6 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_a_id,0,uVar11);
          puVar7 = buffer;
          (**(code **)(lVar6 + 0x1220))(0,0,4,4,0x1908,0x1401,puVar7);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glReadPixels() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                          ,0x427);
          uVar10 = -(uint)(uVar11 < 2) & 0xff;
          lVar12 = 0;
          do {
            lVar9 = 0;
            do {
              if (*(uint *)(puVar7 + lVar9 * 4) !=
                  (uVar10 << 8 | uVar10 << 0x10 | uVar10 << 0x18 | uVar10)) {
                local_1f8._0_8_ =
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                poVar1 = (ostringstream *)(local_1f8 + 8);
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(x=",3);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," y=",3);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"Reference value is different than the rendered data: "
                           ,0x35);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") vs ",5);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_180);
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Rendered data mismatch",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                           ,0x43f);
                goto LAB_00d078a7;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            lVar12 = lVar12 + 1;
            puVar7 = puVar7 + 0x10;
          } while (lVar12 != 4);
          uVar11 = uVar11 + 1;
          if (uVar11 == 4) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_PASS,"Pass");
            return STOP;
          }
        } while( true );
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Could not build program object",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,0x3f8);
    }
    else {
      local_1f8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Draw framebuffer is incomplete: ",0x20);
      (**(code **)(lVar6 + 0x170))(0x8ca9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_180);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Draw framebuffer is incomplete.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,1000);
    }
LAB_00d078a7:
    ppuVar8 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferDepth::iterate(void)
{
	/* General variables */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	unsigned int		  n  = 0;
	unsigned int		  x  = 0;
	unsigned int		  y  = 0;

/* Test-wide definitions */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (4)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1.0);\n"
						  "}\n";

	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout(points)                          in;\n"
						  "layout(triangle_strip, max_vertices=64) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        float depth = -1.0 + float(n) * 0.5;\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, 1, depth, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, -1, depth, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, 1, depth, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, -1, depth, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "}\n";

	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up texture objects we will be using for the test */
	gl.genTextures(1, &m_to_a_id);
	gl.genTextures(1, &m_to_b_id);

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_a_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* levels */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_b_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* levels */, GL_DEPTH_COMPONENT32F, TEXTURE_WIDTH, TEXTURE_HEIGHT,
					TEXTURE_DEPTH);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize texture objects");

	/* Set up framebuffer object we will use for the test */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.genFramebuffers(1, &m_read_fbo_id);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, m_to_b_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize framebuffer object");

	if (gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Draw framebuffer is incomplete: " << gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER)
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw framebuffer is incomplete.");
	}

	/* Set up shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize shader objects");

	/* Set up program object */
	m_po_id = gl.createProgram();

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fs_code, m_gs_id, 1 /* part */, &gs_code, m_vs_id, 1 /* part */,
					  &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build program object");
	}

	/* Set up vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind vertex array object");

	/* Clear the depth attachment before we continue */
	gl.clearColor(0.0f /* red */, 0.0f /* green */, 0.0f /* blue */, 0.0f /* alpha */);
	gl.clearDepthf(0.5f);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Depth buffer clear operation failed");

	/* Render */
	gl.useProgram(m_po_id);
	gl.viewport(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.enable(GL_DEPTH_TEST);
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

	/* Verify the output */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	for (n = 0; n < TEXTURE_DEPTH; ++n)
	{
		unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
		unsigned char ref_color[4];

		/* Determine reference color */
		if (n < 2)
		{
			memset(ref_color, 0xFF, sizeof(ref_color));
		}
		else
		{
			memset(ref_color, 0, sizeof(ref_color));
		}

		/* Read the rendered layer data */
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */, n);
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

		/* Compare all pixels against the reference value */
		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			const unsigned int   pixel_size = N_TEXTURE_COMPONENTS;
			const unsigned int   row_width  = TEXTURE_WIDTH * pixel_size;
			const unsigned char* row_data   = buffer + y * row_width;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
				const unsigned char* result = row_data + x * pixel_size;

				if (memcmp(result, ref_color, sizeof(ref_color)) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(x=" << x << " y=" << y << ") "
									   << "Reference value is different than the rendered data: "
									   << "(" << (unsigned int)ref_color[0] << ", " << (unsigned int)ref_color[1]
									   << ", " << (unsigned int)ref_color[2] << ", " << (unsigned int)ref_color[3]
									   << ") vs "
									   << "(" << (unsigned int)result[0] << ", " << (unsigned int)result[1] << ", "
									   << (unsigned int)result[2] << ", " << (unsigned int)result[3] << ")."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Rendered data mismatch");
				} /* if (memcmp(row_data + x * pixel_size, ref_color, sizeof(ref_color) ) != 0)*/
			}	 /* for (all pixels in a row) */
		}		  /* for (all rows) */
	}			  /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}